

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::Utils::programInfo::build
          (programInfo *this,GLchar *fragment_shader_code,GLchar *vertex_shader_code)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  char *__to;
  char *__from;
  Functions *gl;
  GLchar *vertex_shader_code_local;
  GLchar *fragment_shader_code_local;
  programInfo *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  if (fragment_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x7e2);
    compile(this,this->m_fragment_shader_id,fragment_shader_code);
  }
  if (vertex_shader_code != (GLchar *)0x0) {
    GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar2;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x7ea);
    compile(this,this->m_vertex_shader_id,vertex_shader_code);
  }
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_program_object_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  __from = "CreateProgram";
  glu::checkError(dVar3,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x7f1);
  link(this,__from,__to);
  return;
}

Assistant:

void Utils::programInfo::build(const glw::GLchar* fragment_shader_code, const glw::GLchar* vertex_shader_code)
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create shader objects and compile */
	if (0 != fragment_shader_code)
	{
		m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_fragment_shader_id, fragment_shader_code);
	}

	if (0 != vertex_shader_code)
	{
		m_vertex_shader_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_vertex_shader_id, vertex_shader_code);
	}

	/* Create program object */
	m_program_object_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	/* Link program */
	link();
}